

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::enum_<kratos::EventEdgeType>::enum_<>
          (enum_<kratos::EventEdgeType> *this,handle *scope,char *name)

{
  name local_70;
  is_method local_68;
  arg local_60;
  undefined1 local_50 [16];
  char *local_40;
  object local_38;
  handle local_30;
  type local_22;
  is_new_style_constructor local_21;
  
  class_<kratos::EventEdgeType>::class_<>
            (&this->super_class_<kratos::EventEdgeType>,(handle)scope->m_ptr,name);
  (this->m_base).m_base.m_ptr =
       (this->super_class_<kratos::EventEdgeType>).super_generic_type.super_object.super_handle.
       m_ptr;
  (this->m_base).m_parent.m_ptr = scope->m_ptr;
  detail::enum_base::init(&this->m_base,(EVP_PKEY_CTX *)0x0);
  local_50._0_8_ = "value";
  local_50[8] = 2;
  class_<kratos::EventEdgeType>::
  def<pybind11::detail::initimpl::factory<pybind11::enum_<kratos::EventEdgeType>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(int)_1_,pybind11::detail::void_type(*)(),kratos::EventEdgeType(int),pybind11::detail::void_type()>::execute<pybind11::class_<kratos::EventEdgeType>,pybind11::arg>(pybind11::class_<kratos::EventEdgeType>&,pybind11::arg_const&)&&::_lambda(pybind11::detail::value_and_holder&,int)_1_,pybind11::detail::is_new_style_constructor,pybind11::arg>
            (&this->super_class_<kratos::EventEdgeType>,"__init__",(type_conflict2 *)&local_60,
             (is_new_style_constructor *)&local_30,(arg *)local_50);
  class_<kratos::EventEdgeType>::
  def_property_readonly<pybind11::enum_<kratos::EventEdgeType>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(kratos::EventEdgeType)_1_>
            (&this->super_class_<kratos::EventEdgeType>,"value",(anon_class_1_0_00000001 *)local_50)
  ;
  class_<kratos::EventEdgeType>::
  def<pybind11::enum_<kratos::EventEdgeType>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(kratos::EventEdgeType)_2_>
            (&this->super_class_<kratos::EventEdgeType>,"__int__",(type *)local_50);
  class_<kratos::EventEdgeType>::
  def<pybind11::enum_<kratos::EventEdgeType>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(kratos::EventEdgeType)_3_>
            (&this->super_class_<kratos::EventEdgeType>,"__index__",(type *)local_50);
  local_70.value = "__setstate__";
  local_68.class_.m_ptr =
       (handle)(this->super_class_<kratos::EventEdgeType>).super_generic_type.super_object.
               super_handle.m_ptr;
  local_60.name = "state";
  local_60._8_1_ = 2;
  cpp_function::
  cpp_function<pybind11::enum_<kratos::EventEdgeType>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(pybind11::detail::value_and_holder&,int)_1_,pybind11::detail::is_new_style_constructor,pybind11::name,pybind11::is_method,pybind11::arg,void>
            ((cpp_function *)&local_30,&local_22,&local_21,&local_70,&local_68,&local_60);
  local_50._8_8_ =
       (this->super_class_<kratos::EventEdgeType>).super_generic_type.super_object.super_handle.
       m_ptr;
  local_40 = "__setstate__";
  local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
  detail::accessor_policies::str_attr::set((handle)local_50._8_8_,"__setstate__",local_30);
  object::~object(&local_38);
  object::~object((object *)&local_30);
  return;
}

Assistant:

enum_(const handle &scope, const char *name, const Extra&... extra)
      : class_<Type>(scope, name, extra...), m_base(*this, scope) {
        constexpr bool is_arithmetic = detail::any_of<std::is_same<arithmetic, Extra>...>::value;
        constexpr bool is_convertible = std::is_convertible<Type, Underlying>::value;
        m_base.init(is_arithmetic, is_convertible);

        def(init([](Scalar i) { return static_cast<Type>(i); }), arg("value"));
        def_property_readonly("value", [](Type value) { return (Scalar) value; });
        def("__int__", [](Type value) { return (Scalar) value; });
        #if PY_MAJOR_VERSION < 3
            def("__long__", [](Type value) { return (Scalar) value; });
        #endif
        #if PY_MAJOR_VERSION > 3 || (PY_MAJOR_VERSION == 3 && PY_MINOR_VERSION >= 8)
            def("__index__", [](Type value) { return (Scalar) value; });
        #endif

        attr("__setstate__") = cpp_function(
            [](detail::value_and_holder &v_h, Scalar arg) {
                detail::initimpl::setstate<Base>(v_h, static_cast<Type>(arg),
                        Py_TYPE(v_h.inst) != v_h.type->type); },
            detail::is_new_style_constructor(),
            pybind11::name("__setstate__"), is_method(*this), arg("state"));
    }